

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O2

char * google::protobuf::internal::TcParser::MpString<true>
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  ushort uVar1;
  bool bVar2;
  uint uVar3;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 table_00;
  char *pcVar4;
  TailCallParseFunc UNRECOVERED_JUMPTABLE;
  void *x;
  ushort *puVar5;
  Cord *cord;
  Cord **ppCVar6;
  MicroString *str;
  string *s;
  ulong uVar7;
  uint *puVar8;
  Arena *pAVar9;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 arena;
  ParseContext *extraout_RDX;
  ParseContext *entry;
  ParseContext *extraout_RDX_00;
  ParseContext *extraout_RDX_01;
  ParseContext *ctx_00;
  uint16_t xform_val;
  uint64_t uVar10;
  ushort uVar11;
  string_view wire_bytes;
  string_view sVar12;
  ushort local_54;
  
  uVar10 = hasbits;
  table_00 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
             RefAt<google::protobuf::internal::TcParseTableBase::FieldEntry>
                       (table,(ulong)data.field_0 >> 0x20);
  xform_val = (uint16_t)uVar10;
  if ((data.field_0._0_4_ & 7) != 2) {
    UNRECOVERED_JUMPTABLE = table->fallback;
    goto LAB_001e9be9;
  }
  uVar1 = *(uint16_t *)(table_00.data + 10);
  uVar11 = uVar1 & 0x30;
  if (uVar11 == 0x20) {
    pcVar4 = MpRepeatedString<true>(msg,ptr,ctx,data,table,hasbits);
    return pcVar4;
  }
  if (uVar11 == 0x10) {
    anon_unknown_105::SetHas((FieldEntry *)table_00,msg);
    bVar2 = false;
  }
  else if (uVar11 == 0x30) {
    bVar2 = ChangeOneof(table,(FieldEntry *)table_00,data.field_0._0_4_ >> 3,
                        (ParseContext *)(ulong)(uVar1 & 0x600),msg);
  }
  else {
    bVar2 = false;
  }
  x = MaybeGetSplitBase(msg,true,table);
  local_54 = (ushort)(uVar1 & 0x600);
  if ((uVar1 & 0x1c0) == 0x140) {
    str = RefAt<google::protobuf::internal::MicroString>(x,(ulong)*(uint *)table_00);
    if (bVar2 != false) {
      str->rep_ = (void *)0x0;
    }
    pAVar9 = (Arena *)(msg->_internal_metadata_).ptr_;
    if (((ulong)pAVar9 & 1) != 0) {
      pAVar9 = *(Arena **)((ulong)pAVar9 & 0xfffffffffffffffe);
    }
    puVar5 = (ushort *)
             EpsCopyInputStream::ReadMicroString(&ctx->super_EpsCopyInputStream,ptr,str,pAVar9);
    sVar12 = MicroString::Get(str);
LAB_001e9de9:
    wire_bytes._M_len = (TcParseTableBase *)sVar12._M_str;
    wire_bytes._M_str = (char *)table;
    bVar2 = MpVerifyUtf8((TcParser *)sVar12._M_len,wire_bytes,(TcParseTableBase *)table_00,
                         (FieldEntry *)(ulong)local_54,xform_val);
    arena = table_00;
    ctx_00 = extraout_RDX;
  }
  else {
    if ((uVar1 & 0x1c0) != 0x80) {
      if ((uVar1 & 0x1c0) != 0) {
        Unreachable("/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                    ,0x967);
      }
      wire_bytes._M_len =
           (TcParseTableBase *)
           RefAt<google::protobuf::internal::ArenaStringPtr>(x,(ulong)*(uint *)table_00);
      if (bVar2 != false) {
        *(undefined8 **)wire_bytes._M_len = &fixed_address_empty_string;
      }
      arena = (anon_union_8_1_898a9ca8_for_TcFieldData_0)(msg->_internal_metadata_).ptr_;
      if ((arena.data & 1) != 0) {
        arena = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                ((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)(arena.data & 0xfffffffffffffffe))->
                data;
      }
      if ((Arena *)arena.data == (Arena *)0x0) {
        s = ArenaStringPtr::MutableNoCopy_abi_cxx11_
                      ((ArenaStringPtr *)wire_bytes._M_len,(Arena *)0x0);
        puVar5 = (ushort *)InlineGreedyStringParser(s,ptr,ctx);
      }
      else {
        puVar5 = (ushort *)
                 EpsCopyInputStream::ReadArenaString
                           (&ctx->super_EpsCopyInputStream,ptr,(ArenaStringPtr *)wire_bytes._M_len,
                            (Arena *)arena);
      }
      if (puVar5 == (ushort *)0x0) {
        anon_unknown_105::EnsureArenaStringIsNotDefault(msg,(ArenaStringPtr *)wire_bytes._M_len);
        ctx_00 = extraout_RDX_01;
        ptr = (char *)wire_bytes._M_len;
        goto LAB_001e9eba;
      }
      sVar12._M_str = *(char **)((ulong)*(void **)wire_bytes._M_len & 0xfffffffffffffffc);
      sVar12._M_len = ((undefined8 *)((ulong)*(void **)wire_bytes._M_len & 0xfffffffffffffffc))[1];
      goto LAB_001e9de9;
    }
    if (uVar11 == 0x30) {
      if (bVar2 == false) {
        ppCVar6 = RefAt<absl::lts_20250127::Cord*>(msg,(ulong)*(uint *)table_00);
        cord = *ppCVar6;
        arena = table_00;
      }
      else {
        pAVar9 = (Arena *)(msg->_internal_metadata_).ptr_;
        if (((ulong)pAVar9 & 1) != 0) {
          pAVar9 = *(Arena **)((ulong)pAVar9 & 0xfffffffffffffffe);
        }
        arena = table_00;
        cord = Arena::Create<absl::lts_20250127::Cord>(pAVar9);
        ppCVar6 = RefAt<absl::lts_20250127::Cord*>(msg,(ulong)*(uint *)table_00);
        *ppCVar6 = cord;
      }
    }
    else {
      cord = RefAt<absl::lts_20250127::Cord>(x,(ulong)*(uint *)table_00);
      arena = table_00;
    }
    puVar5 = (ushort *)InlineCordParser(cord,ptr,ctx);
    ctx_00 = entry;
    if (puVar5 == (ushort *)0x0) goto LAB_001e9eba;
    arena.data._2_6_ = 0;
    arena.data._0_2_ = local_54;
    MpVerifyUtf8(cord,(TcParseTableBase *)ptr,(FieldEntry *)entry,local_54);
    bVar2 = true;
    ctx_00 = extraout_RDX_00;
    wire_bytes._M_len = (TcParseTableBase *)ptr;
  }
  ptr = (char *)wire_bytes._M_len;
  if ((bVar2 == false) || (puVar5 == (ushort *)0x0)) {
LAB_001e9eba:
    pcVar4 = Error(msg,ptr,ctx_00,(TcFieldData)arena,table,hasbits);
    return pcVar4;
  }
  if ((ctx->super_EpsCopyInputStream).limit_end_ <= puVar5) {
    if ((ulong)table->has_bits_offset != 0) {
      puVar8 = RefAt<unsigned_int>(msg,(ulong)table->has_bits_offset);
      *puVar8 = *puVar8 | (uint)hasbits;
    }
    return (char *)puVar5;
  }
  uVar3 = (uint)table->fast_idx_mask & (uint)*puVar5;
  if ((uVar3 & 7) != 0) {
    protobuf_assumption_failed
              ("(idx & 7) == 0",
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
               ,0x452);
  }
  uVar7 = (ulong)(uVar3 & 0xfffffff8);
  data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                 ((ulong)*puVar5 ^ *(ulong *)(&table[1].fast_idx_mask + uVar7 * 2));
  UNRECOVERED_JUMPTABLE = *(TailCallParseFunc *)(&table[1].has_bits_offset + uVar7);
  ptr = (char *)puVar5;
LAB_001e9be9:
  pcVar4 = (*UNRECOVERED_JUMPTABLE)(msg,ptr,ctx,data,table,hasbits);
  return pcVar4;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::MpString(PROTOBUF_TC_PARAM_DECL) {
  const auto& entry = RefAt<FieldEntry>(table, data.entry_offset());
  const uint16_t type_card = entry.type_card;
  const uint16_t card = type_card & field_layout::kFcMask;
  const uint32_t decoded_wiretype = data.tag() & 7;

  if (decoded_wiretype != WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
    PROTOBUF_MUSTTAIL return table->fallback(PROTOBUF_TC_PARAM_PASS);
  }
  if (card == field_layout::kFcRepeated) {
    PROTOBUF_MUSTTAIL return MpRepeatedString<is_split>(PROTOBUF_TC_PARAM_PASS);
  }
  const uint16_t xform_val = type_card & field_layout::kTvMask;
  const uint16_t rep = type_card & field_layout::kRepMask;

  // Mark the field as present:
  const bool is_oneof = card == field_layout::kFcOneof;
  bool need_init = false;
  if (card == field_layout::kFcOptional) {
    SetHas(entry, msg);
  } else if (is_oneof) {
    need_init = ChangeOneof(table, entry, data.tag() >> 3, ctx, msg);
  }

  bool is_valid = false;
  void* const base = MaybeGetSplitBase(msg, is_split, table);
  switch (rep) {
    case field_layout::kRepAString: {
      auto& field = RefAt<ArenaStringPtr>(base, entry.offset);
      if (need_init) field.InitDefault();
      Arena* arena = msg->GetArena();
      if (arena) {
        ptr = ctx->ReadArenaString(ptr, &field, arena);
      } else {
        std::string* str = field.MutableNoCopy(nullptr);
        ptr = InlineGreedyStringParser(str, ptr, ctx);
      }
      if (ABSL_PREDICT_FALSE(ptr == nullptr)) {
        EnsureArenaStringIsNotDefault(msg, &field);
        break;
      }
      is_valid = MpVerifyUtf8(field.Get(), table, entry, xform_val);
      break;
    }

    case field_layout::kRepMString: {
      auto& field = RefAt<MicroString>(base, entry.offset);
      if (need_init) field.InitDefault();
      ptr = ctx->ReadMicroString(ptr, field, msg->GetArena());
      is_valid = MpVerifyUtf8(field.Get(), table, entry, xform_val);
      break;
    }


    case field_layout::kRepCord: {
      absl::Cord* field;
      if (is_oneof) {
        if (need_init) {
          field = Arena::Create<absl::Cord>(msg->GetArena());
          RefAt<absl::Cord*>(msg, entry.offset) = field;
        } else {
          field = RefAt<absl::Cord*>(msg, entry.offset);
        }
      } else {
        field = &RefAt<absl::Cord>(base, entry.offset);
      }
      ptr = InlineCordParser(field, ptr, ctx);
      if (!ptr) break;
      is_valid = MpVerifyUtf8(*field, table, entry, xform_val);
      break;
    }

    default:
      Unreachable();
  }

  if (ABSL_PREDICT_FALSE(ptr == nullptr || !is_valid)) {
    PROTOBUF_MUSTTAIL return Error(PROTOBUF_TC_PARAM_NO_DATA_PASS);
  }
  PROTOBUF_MUSTTAIL return ToTagDispatch(PROTOBUF_TC_PARAM_NO_DATA_PASS);
}